

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

HalfedgeHandle __thiscall
OpenMesh::PolyConnectivity::insert_edge
          (PolyConnectivity *this,HalfedgeHandle _prev_heh,HalfedgeHandle _next_heh)

{
  pointer *ppFVar1;
  VertexHandle _start_vh;
  VertexHandle _end_vh;
  HalfedgeHandle _nheh;
  HalfedgeHandle _heh;
  FaceHandle _fh;
  iterator __position;
  pointer ppBVar2;
  BaseProperty *pBVar3;
  BaseHandle _nheh_00;
  int iVar4;
  FaceHandle _fh_00;
  Halfedge *pHVar5;
  undefined4 extraout_var;
  Face *pFVar6;
  HalfedgeHandle _nheh_01;
  pointer ppBVar7;
  undefined1 local_60 [8];
  FaceHalfedgeIter fh_it;
  
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_prev_heh);
  iVar4 = (pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_next_heh);
  if (iVar4 != (pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_) {
    __assert_fail("face_handle(_prev_heh) == face_handle(_next_heh)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3d2,
                  "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::insert_edge(HalfedgeHandle, HalfedgeHandle)"
                 );
  }
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_prev_heh);
  if ((BaseHandle)(pHVar5->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
      == _next_heh.super_BaseHandle.idx_) {
    __assert_fail("next_halfedge_handle(_prev_heh) != _next_heh",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x3d3,
                  "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::insert_edge(HalfedgeHandle, HalfedgeHandle)"
                 );
  }
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_prev_heh);
  _start_vh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar5->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pHVar5 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,
                      (HalfedgeHandle)
                      ((-((uint)_next_heh.super_BaseHandle.idx_ & 1) | 1) +
                      (int)_next_heh.super_BaseHandle.idx_));
  _end_vh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar5->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
       _start_vh.super_BaseHandle.idx_;
  _nheh_00.idx_ = (int)ArrayKernel::new_edge(&this->super_ArrayKernel,_start_vh,_end_vh);
  _nheh_01.super_BaseHandle.idx_ = (BaseHandle)((-(_nheh_00.idx_ & 1U) | 1) + _nheh_00.idx_);
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_prev_heh);
  _nheh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar5->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_next_heh);
  _heh.super_BaseHandle.idx_ = (BaseHandle)(pHVar5->prev_halfedge_handle_).super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,_prev_heh,(HalfedgeHandle)_nheh_00.idx_);
  ArrayKernel::set_next_halfedge_handle
            (&this->super_ArrayKernel,(HalfedgeHandle)_nheh_00.idx_,_next_heh);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh_01);
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_nheh_01,_nheh);
  local_60._0_4_ = 0xffffffff;
  __position._M_current =
       (this->super_ArrayKernel).faces_.
       super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_ArrayKernel).faces_.
      super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>::
    _M_realloc_insert<OpenMesh::ArrayItems::Face>
              (&(this->super_ArrayKernel).faces_,__position,(Face *)local_60);
  }
  else {
    ((__position._M_current)->halfedge_handle_).super_BaseHandle.idx_ = -1;
    ppFVar1 = &(this->super_ArrayKernel).faces_.
               super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + 1;
  }
  iVar4 = (*(this->super_ArrayKernel).super_BaseKernel._vptr_BaseKernel[5])(this);
  ppBVar2 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar7 = (this->super_ArrayKernel).super_BaseKernel.fprops_.properties_.
                 super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppBVar7 != ppBVar2;
      ppBVar7 = ppBVar7 + 1) {
    pBVar3 = *ppBVar7;
    if (pBVar3 != (BaseProperty *)0x0) {
      (*pBVar3->_vptr_BaseProperty[3])(pBVar3,CONCAT44(extraout_var,iVar4));
    }
  }
  _fh_00 = ArrayKernel::handle(&this->super_ArrayKernel,
                               (this->super_ArrayKernel).faces_.
                               super__Vector_base<OpenMesh::ArrayItems::Face,_std::allocator<OpenMesh::ArrayItems::Face>_>
                               ._M_impl.super__Vector_impl_data._M_finish + -1);
  pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00.super_BaseHandle.idx_);
  (pFVar6->halfedge_handle_).super_BaseHandle.idx_ = _nheh_00.idx_;
  pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh_00.super_BaseHandle.idx_);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pFVar6->halfedge_handle_).super_BaseHandle.idx_;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  local_60 = (undefined1  [8])this;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
       fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
  if (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ != -1) {
    do {
      if ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ ==
           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) break;
      pHVar5 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_
                         );
      (pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
           (int)_fh_00.super_BaseHandle.idx_;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_60);
    } while (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh);
  _fh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar5 = ArrayKernel::halfedge(&this->super_ArrayKernel,_nheh_01);
  (pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ =
       (int)_fh.super_BaseHandle.idx_;
  if (_fh.super_BaseHandle.idx_ != -1) {
    pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
    pHVar5 = ArrayKernel::halfedge
                       (&this->super_ArrayKernel,
                        (HalfedgeHandle)(pFVar6->halfedge_handle_).super_BaseHandle.idx_);
    if ((BaseHandle)(pHVar5->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ ==
        _fh_00.super_BaseHandle.idx_) {
      pFVar6 = ArrayKernel::face(&this->super_ArrayKernel,_fh);
      (pFVar6->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh_01.super_BaseHandle.idx_;
    }
  }
  adjust_outgoing_halfedge
            (this,(VertexHandle)
                  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_);
  adjust_outgoing_halfedge(this,_end_vh);
  return (BaseHandle)(BaseHandle)_nheh_00.idx_;
}

Assistant:

PolyConnectivity::HalfedgeHandle
PolyConnectivity::insert_edge(HalfedgeHandle _prev_heh, HalfedgeHandle _next_heh)
{
  assert(face_handle(_prev_heh) == face_handle(_next_heh));//only the manifold case
  assert(next_halfedge_handle(_prev_heh) != _next_heh);//this can not be done
  VertexHandle vh0 = to_vertex_handle(_prev_heh);
  VertexHandle vh1 = from_vertex_handle(_next_heh);
  //create the link between vh0 and vh1
  HalfedgeHandle heh0 = new_edge(vh0, vh1);
  HalfedgeHandle heh1 = opposite_halfedge_handle(heh0);
  HalfedgeHandle next_prev_heh = next_halfedge_handle(_prev_heh);
  HalfedgeHandle prev_next_heh = prev_halfedge_handle(_next_heh);
  set_next_halfedge_handle(_prev_heh, heh0);
  set_next_halfedge_handle(heh0, _next_heh);
  set_next_halfedge_handle(prev_next_heh, heh1);
  set_next_halfedge_handle(heh1, next_prev_heh);
  
  //now set the face handles - the new face is assigned to heh0
  FaceHandle new_fh = new_face();
  set_halfedge_handle(new_fh, heh0);
  for (FaceHalfedgeIter fh_it = fh_iter(new_fh); fh_it.is_valid(); ++fh_it)
  {
    set_face_handle(*fh_it, new_fh);
  }  
  FaceHandle old_fh = face_handle(next_prev_heh);
  set_face_handle(heh1, old_fh);   
  if (old_fh.is_valid() && face_handle(halfedge_handle(old_fh)) == new_fh)
  {//fh pointed to one of the halfedges now assigned to new_fh
    set_halfedge_handle(old_fh, heh1);
  }
  adjust_outgoing_halfedge(vh0);  
  adjust_outgoing_halfedge(vh1);  
  return heh0;
}